

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsics.h
# Opt level: O3

int64_t get_tsc(void)

{
  int64_t iVar1;
  
  iVar1 = rdtsc();
  return iVar1;
}

Assistant:

__forceinline uint64_t read_tsc()  {
#if defined(__X86_ASM__)
    uint32_t high,low;
    asm volatile ("rdtsc" : "=d"(high), "=a"(low));
    return (((uint64_t)high) << 32) + (uint64_t)low;
#else
    /* Not supported yet, meaning measuring traversal cost per pixel does not work. */
    return 0;
#endif
  }